

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDPublicKey.cpp
# Opt level: O2

bool __thiscall EDPublicKey::deserialise(EDPublicKey *this,ByteString *serialised)

{
  size_t sVar1;
  bool bVar2;
  ByteString dA;
  ByteString dEC;
  ByteString BStack_68;
  ByteString local_40;
  
  ByteString::chainDeserialise(&local_40,serialised);
  ByteString::chainDeserialise(&BStack_68,serialised);
  sVar1 = ByteString::size(&local_40);
  if (sVar1 != 0) {
    sVar1 = ByteString::size(&BStack_68);
    if (sVar1 != 0) {
      (**(code **)(*(long *)this + 0x38))(this,&local_40);
      bVar2 = true;
      (**(code **)(*(long *)this + 0x40))(this,&BStack_68);
      goto LAB_0012c944;
    }
  }
  bVar2 = false;
LAB_0012c944:
  ByteString::~ByteString(&BStack_68);
  ByteString::~ByteString(&local_40);
  return bVar2;
}

Assistant:

bool EDPublicKey::deserialise(ByteString& serialised)
{
	ByteString dEC = ByteString::chainDeserialise(serialised);
	ByteString dA = ByteString::chainDeserialise(serialised);

	if ((dEC.size() == 0) ||
	    (dA.size() == 0))
	{
		return false;
	}

	setEC(dEC);
	setA(dA);

	return true;
}